

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffio.c
# Opt level: O0

void tidyBufAppend(TidyBuffer *buf,void *vp,uint size)

{
  uint size_local;
  void *vp_local;
  TidyBuffer *buf_local;
  
  if (buf != (TidyBuffer *)0x0) {
    if ((vp != (void *)0x0) && (size != 0)) {
      tidyBufCheckAlloc(buf,buf->size + size,0);
      memcpy(buf->bp + buf->size,vp,(ulong)size);
      buf->size = size + buf->size;
    }
    return;
  }
  __assert_fail("buf != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/buffio.c"
                ,0xa7,"void tidyBufAppend(TidyBuffer *, void *, uint)");
}

Assistant:

void TIDY_CALL tidyBufAppend( TidyBuffer* buf, void* vp, uint size )
{
    assert( buf != NULL );
    if ( vp != NULL && size > 0 )
    {
        tidyBufCheckAlloc( buf, buf->size + size, 0 );
        memcpy( buf->bp + buf->size, vp, size );
        buf->size += size;
    }
}